

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

string * phosg::load_file(string *__return_storage_ptr__,string *filename)

{
  uint uVar1;
  size_type sVar2;
  uint *puVar3;
  runtime_error *this;
  int error;
  scoped_fd fd;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  size_type local_90;
  
  scoped_fd::scoped_fd(&fd,filename,0,0x1ed);
  fstat((int)&local_c0,(stat *)(ulong)(uint)fd.fd);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (__return_storage_ptr__,local_90,'\0');
  sVar2 = ::read(fd.fd,(__return_storage_ptr__->_M_dataplus)._M_p,
                 __return_storage_ptr__->_M_string_length);
  if (sVar2 == local_90) {
    scoped_fd::~scoped_fd(&fd);
    return __return_storage_ptr__;
  }
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  if (uVar1 == 0) {
    string_printf_abi_cxx11_
              (&local_c0,"can\'t read from %s: %zd/%zd bytes read",(filename->_M_dataplus)._M_p,
               sVar2,local_90);
    ::std::runtime_error::runtime_error(this,(string *)&local_c0);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::operator+(&local_100,"can\'t read from ",filename);
  ::std::operator+(&local_e0,&local_100,": ");
  string_for_error_abi_cxx11_(&local_120,(phosg *)(ulong)*puVar3,error);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                   &local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
  ::std::runtime_error::runtime_error(this,(string *)&local_c0);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string load_file(const string& filename) {
  scoped_fd fd(filename, O_RDONLY);
  ssize_t file_size = fstat(fd).st_size;

  string data(file_size, 0);
  ssize_t bytes_read = ::read(fd, data.data(), data.size());
  if (bytes_read != file_size) {
    if (errno == 0) {
      throw runtime_error(string_printf("can\'t read from %s: %zd/%zd bytes read",
          filename.c_str(), bytes_read, file_size));
    } else {
      throw runtime_error("can\'t read from " + filename + ": " + string_for_error(errno));
    }
  }

  return data;
}